

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int ShLinkExt(ShHandle linkHandle,ShHandle *compHandles,int numHandles)

{
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  TPoolAllocator *poolAllocator;
  long *plVar7;
  ulong uVar8;
  THandleList cObjects;
  TShHandleBase *local_60;
  TPoolAllocator *local_58;
  long lStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long *local_38;
  
  uVar4 = 0;
  if (numHandles != 0 && linkHandle != (ShHandle)0x0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = (TPoolAllocator *)0x0;
    lStack_50 = 0;
    local_38 = (long *)linkHandle;
    local_58 = glslang::GetThreadPoolAllocator();
    lStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    if (0 < numHandles) {
      uVar8 = 0;
      do {
        plVar6 = (long *)compHandles[uVar8];
        if (plVar6 == (long *)0x0) goto LAB_0034e9d8;
        lVar5 = (**(code **)(*plVar6 + 0x18))(plVar6);
        if (lVar5 != 0) {
          local_60 = (TShHandleBase *)(**(code **)(*plVar6 + 0x18))(plVar6);
          std::vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>>::
          emplace_back<TShHandleBase*>
                    ((vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>> *)&local_58,
                     &local_60);
        }
        lVar5 = (**(code **)(*plVar6 + 0x10))(plVar6);
        if (lVar5 != 0) {
          local_60 = (TShHandleBase *)(**(code **)(*plVar6 + 0x10))(plVar6);
          std::vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>>::
          emplace_back<TShHandleBase*>
                    ((vector<TShHandleBase*,glslang::pool_allocator<TShHandleBase*>> *)&local_58,
                     &local_60);
        }
        if (*(long *)(lStack_50 + uVar8 * 8) == 0) goto LAB_0034e9d8;
        uVar8 = uVar8 + 1;
      } while ((uint)numHandles != uVar8);
    }
    plVar6 = (long *)(**(code **)(*local_38 + 0x18))();
    if (plVar6 == (long *)0x0) {
LAB_0034e9d8:
      uVar4 = 0;
    }
    else {
      poolAllocator = (TPoolAllocator *)(**(code **)(*plVar6 + 0x28))(plVar6);
      glslang::SetThreadPoolAllocator(poolAllocator);
      puVar1 = (undefined8 *)plVar6[2];
      puVar1[1] = 0;
      *(undefined1 *)*puVar1 = 0;
      if (0 < numHandles) {
        uVar8 = 0;
        do {
          lVar5 = (**(code **)(**(long **)(lStack_50 + uVar8 * 8) + 0x10))();
          if (lVar5 != 0) {
            plVar7 = (long *)(**(code **)(**(long **)(lStack_50 + uVar8 * 8) + 0x10))();
            cVar2 = (**(code **)(*plVar7 + 0x40))(plVar7);
            if (cVar2 == '\0') {
              glslang::TInfoSinkBase::message
                        ((TInfoSinkBase *)plVar6[2],EPrefixError,
                         "Not all shaders have valid object code.");
              goto LAB_0034e9d8;
            }
          }
          uVar8 = uVar8 + 1;
        } while ((uint)numHandles != uVar8);
      }
      bVar3 = (**(code **)(*plVar6 + 0x38))(plVar6,&local_58);
      uVar4 = (uint)bVar3;
    }
  }
  return uVar4;
}

Assistant:

int ShLinkExt(
    const ShHandle linkHandle,
    const ShHandle compHandles[],
    const int numHandles)
{
    if (linkHandle == nullptr || numHandles == 0)
        return 0;

    THandleList cObjects;

    for (int i = 0; i < numHandles; ++i) {
        if (compHandles[i] == nullptr)
            return 0;
        TShHandleBase* base = reinterpret_cast<TShHandleBase*>(compHandles[i]);
        if (base->getAsLinker()) {
            cObjects.push_back(base->getAsLinker());
        }
        if (base->getAsCompiler())
            cObjects.push_back(base->getAsCompiler());

        if (cObjects[i] == nullptr)
            return 0;
    }

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(linkHandle);
    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());

    if (linker == nullptr)
        return 0;
    
    SetThreadPoolAllocator(linker->getPool());
    linker->infoSink.info.erase();

    for (int i = 0; i < numHandles; ++i) {
        if (cObjects[i]->getAsCompiler()) {
            if (! cObjects[i]->getAsCompiler()->linkable()) {
                linker->infoSink.info.message(EPrefixError, "Not all shaders have valid object code.");
                return 0;
            }
        }
    }

    bool ret = linker->link(cObjects);

    return ret ? 1 : 0;
}